

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void CheckForListElements(TidyDocImpl *doc,Node *node)

{
  int *piVar1;
  TidyTagId TVar2;
  Node *node_00;
  Node **ppNVar3;
  
  if ((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) {
    TVar2 = node->tag->id;
    if ((TVar2 == TidyTag_UL) || (TVar2 == TidyTag_OL)) {
      piVar1 = &(doc->access).OtherListElements;
      *piVar1 = *piVar1 + 1;
    }
    else if (TVar2 == TidyTag_LI) {
      piVar1 = &(doc->access).ListElements;
      *piVar1 = *piVar1 + 1;
    }
  }
  ppNVar3 = &node->content;
  while (node_00 = *ppNVar3, node_00 != (Node *)0x0) {
    CheckForListElements(doc,node_00);
    ppNVar3 = &node_00->next;
  }
  return;
}

Assistant:

static void CheckForListElements( TidyDocImpl* doc, Node* node )
{
    if ( nodeIsLI(node) )
    {
        doc->access.ListElements++;
    }
    else if ( nodeIsOL(node) || nodeIsUL(node) )
    {
        doc->access.OtherListElements++;
    }

    for ( node = node->content; node != NULL; node = node->next )
    {
        CheckForListElements( doc, node );
    }
}